

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

bool ImNodes::BeginNode(void *node_id,ImVec2 *pos,bool *selected)

{
  long lVar1;
  ImVec2 IVar2;
  float *pfVar3;
  ImGuiStyle *pIVar4;
  ImDrawList *this;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar6;
  ImVec2 local_50;
  undefined1 local_48 [24];
  
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x179,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (node_id == (void *)0x0) {
    __assert_fail("node_id != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x17a,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (pos == (ImVec2 *)0x0) {
    __assert_fail("pos != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x17b,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
  }
  if (selected != (bool *)0x0) {
    pIVar4 = ImGui::GetStyle();
    this = ImGui::GetWindowDrawList();
    pfVar3 = gCanvas;
    lVar1 = *(long *)(gCanvas + 0x26);
    *(void **)(lVar1 + 0x10) = node_id;
    *(ImVec2 **)(lVar1 + 0x18) = pos;
    *(bool **)(lVar1 + 0x20) = selected;
    ImDrawList::ChannelsSplit(this,2);
    if (*(void **)(lVar1 + 0x38) == node_id) {
      IVar2 = ImGui::GetWindowPos();
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_4_ = IVar2.x;
      local_48._4_4_ = IVar2.y;
      local_48._12_4_ = extraout_XMM0_Dd;
      IVar2 = ImGui::GetWindowSize();
      fVar5 = IVar2.y + (float)local_48._4_4_ + (pIVar4->WindowPadding).y;
      fVar6 = (pIVar4->WindowPadding).x + IVar2.x + (float)local_48._0_4_;
    }
    else {
      IVar2 = ImGui::GetWindowPos();
      fVar6 = pos->x * *pfVar3 + IVar2.x + pfVar3[1];
      fVar5 = IVar2.y + *pfVar3 * pos->y + pfVar3[2];
    }
    local_50.y = fVar5;
    local_50.x = fVar6;
    ImGui::SetCursorScreenPos(&local_50);
    ImGui::PushID(node_id);
    ImGui::BeginGroup();
    ImDrawList::ChannelsSetCurrent(this,1);
    return true;
  }
  __assert_fail("selected != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x17c,"bool ImNodes::BeginNode(void *, ImVec2 *, bool *)");
}

Assistant:

bool BeginNode(void* node_id, ImVec2* pos, bool* selected)
{
    assert(gCanvas != nullptr);
    assert(node_id != nullptr);
    assert(pos != nullptr);
    assert(selected != nullptr);
    const ImGuiStyle& style = ImGui::GetStyle();
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    impl->node.id = node_id;
    impl->node.pos = pos;
    impl->node.selected = selected;

    // 0 - node rect, curves
    // 1 - node content
    draw_list->ChannelsSplit(2);

    if (node_id == impl->auto_position_node_id)
    {
        // Somewhere out of view so that we dont see node flicker when it will be repositioned
        ImGui::SetCursorScreenPos(ImGui::GetWindowPos() + ImGui::GetWindowSize() + style.WindowPadding);
    }
    else
    {
        // Top-let corner of the node
        ImGui::SetCursorScreenPos(ImGui::GetWindowPos() + (*pos) * canvas->zoom + canvas->offset);
    }

    ImGui::PushID(node_id);

    ImGui::BeginGroup();    // Slots and content group
    draw_list->ChannelsSetCurrent(1);

    return true;
}